

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_named_interface_blocks.cpp
# Opt level: O1

void lower_named_interface_blocks(void *mem_ctx,gl_linked_shader *shader)

{
  undefined1 *puVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  exec_list *l;
  exec_node *peVar5;
  exec_node *peVar6;
  char *pcVar7;
  hash_entry *phVar8;
  char *name;
  glsl_type *type;
  ir_variable *this;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  glsl_type *t;
  exec_node *peVar17;
  exec_node *peVar18;
  exec_node *peVar19;
  ulong uVar20;
  flatten_named_interface_blocks_declarations v_decl;
  ir_hierarchical_visitor local_78;
  void *local_40;
  hash_table *local_38;
  
  ir_hierarchical_visitor::ir_hierarchical_visitor(&local_78);
  local_78._vptr_ir_hierarchical_visitor = (_func_int **)&PTR_visit_0025c958;
  local_38 = (hash_table *)0x0;
  l = shader->ir;
  local_40 = mem_ctx;
  local_38 = _mesa_hash_table_create((void *)0x0,_mesa_hash_string,_mesa_key_string_equal);
  peVar19 = (l->head_sentinel).next;
  peVar17 = peVar19->next;
  peVar19 = (exec_node *)&peVar19[-1].prev;
  if (peVar17 == (exec_node *)0x0) {
    peVar5 = (exec_node *)0x0;
    peVar19 = (exec_node *)0x0;
  }
  else {
    peVar5 = (exec_node *)&peVar17[-1].prev;
    if (peVar17->next == (exec_node *)0x0) {
      peVar5 = (exec_node *)0x0;
    }
  }
  do {
    peVar6 = peVar5;
    if (peVar17 == (exec_node *)0x0) {
      visit_list_elements(&local_78,l,true);
      _mesa_hash_table_destroy(local_38,(_func_void_hash_entry_ptr *)0x0);
      return;
    }
    if (*(int *)&peVar19[1].prev == 7) {
      peVar5 = peVar19[2].next;
      cVar2 = *(char *)((long)&peVar5->next + 4);
      peVar17 = peVar5;
      cVar3 = cVar2;
      while (cVar3 == '\x11') {
        peVar17 = peVar17[2].next;
        cVar3 = *(char *)((long)&peVar17->next + 4);
      }
      if ((peVar17 == peVar19[8].prev) && (1 < (*(uint *)&peVar19[4].next >> 0xc & 0xf) - 1)) {
        while (cVar2 == '\x11') {
          peVar5 = peVar5[2].next;
          cVar2 = *(char *)((long)&peVar5->next + 4);
        }
        if (*(char *)((long)&peVar5->next + 4) != '\x10') {
          __assert_fail("iface_t->is_interface()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_named_interface_blocks.cpp"
                        ,0x99,
                        "void (anonymous namespace)::flatten_named_interface_blocks_declarations::run(exec_list *)"
                       );
        }
        if (*(int *)((long)&peVar5->prev + 4) != 0) {
          lVar16 = 0;
          uVar20 = 0;
          peVar17 = (exec_node *)&peVar19->prev;
          do {
            pcVar7 = " out";
            if (((ulong)peVar19[4].next & 0xf000) == 0x4000) {
              pcVar7 = " in";
            }
            pcVar7 = ralloc_asprintf(local_40,"%s %s.%s.%s",pcVar7 + 1,peVar5[1].next,
                                     peVar19[2].prev,
                                     *(undefined8 *)((long)&(peVar5[2].next)->prev + lVar16));
            phVar8 = _mesa_hash_table_search(local_38,pcVar7);
            if ((phVar8 == (hash_entry *)0x0) || (peVar18 = peVar17, phVar8->data == (void *)0x0)) {
              name = ralloc_strdup(local_40,*(char **)((long)&(peVar5[2].next)->prev + lVar16));
              if (((glsl_type *)peVar19[2].next)->field_0x4 == '\x11') {
                type = process_array_type((glsl_type *)peVar19[2].next,(uint)uVar20);
                this = (ir_variable *)exec_node::operator_new(0x90,local_40);
                uVar4 = *(uint *)&peVar19[4].next;
              }
              else {
                this = (ir_variable *)exec_node::operator_new(0x90,local_40);
                type = *(glsl_type **)((long)&(peVar5[2].next)->next + lVar16);
                uVar4 = *(uint *)&peVar19[4].next;
              }
              ir_variable::ir_variable
                        (this,type,name,uVar4 >> 0xc & (ir_var_mode_count|ir_var_shader_shared));
              uVar4 = *(uint *)((long)&peVar5[2].next[1].next + lVar16);
              (this->data).location = uVar4;
              uVar9 = ~uVar4 >> 0xd & 0x40000;
              uVar4 = *(uint *)&this->data;
              *(uint *)&this->data = uVar4 & 0xfffbffff | uVar9;
              (this->data).offset = *(uint *)((long)&peVar5[2].next[1].next + lVar16 + 4);
              uVar10 = ~*(uint *)((long)&peVar5[2].next[1].next + lVar16 + 4) >> 4 & 0x8000000;
              *(uint *)&this->data = uVar4 & 0xf7fbffff | uVar9 | uVar10;
              (this->data).xfb_buffer = *(uint *)((long)&peVar5[2].next[1].prev + lVar16);
              uVar11 = (*(byte *)((long)&peVar5[2].next[2].prev + lVar16) & 1) << 0x1a;
              *(uint *)&this->data = uVar4 & 0xf3fbffff | uVar9 | uVar10 | uVar11;
              uVar12 = (*(ushort *)((long)&peVar5[2].next[2].next + lVar16) & 3) << 0x10;
              *(uint *)&this->data = uVar4 & 0xf3f8ffff | uVar9 | uVar10 | uVar11 | uVar12;
              uVar13 = *(uint *)((long)&peVar5[2].next[2].next + lVar16) >> 2 & 2;
              *(uint *)&this->data = uVar4 & 0xf3f8fffd | uVar9 | uVar10 | uVar11 | uVar12 | uVar13;
              uVar14 = *(uint *)((long)&peVar5[2].next[2].next + lVar16) >> 2 & 4;
              *(uint *)&this->data =
                   uVar4 & 0xf3f8fff9 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14;
              uVar15 = *(uint *)((long)&peVar5[2].next[2].next + lVar16) >> 4 & 8;
              *(uint *)&this->data =
                   uVar4 & 0xf3f8fff1 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15;
              (this->data).stream = *(uint *)&peVar19[5].prev;
              *(uint *)&this->data =
                   uVar4 & 0xf3f8f3f1 | uVar9 | uVar10 | uVar11 | uVar12 | uVar13 | uVar14 | uVar15
                   | *(uint *)&peVar19[4].next & 0xc00;
              puVar1 = &(this->data).field_0x4;
              *puVar1 = *puVar1 | 4;
              ir_variable::init_interface_type(this,(glsl_type *)peVar19[2].next);
              _mesa_hash_table_insert(local_38,pcVar7,this);
              peVar18 = &(this->super_ir_instruction).super_exec_node;
              (this->super_ir_instruction).super_exec_node.next = peVar17->next;
              (this->super_ir_instruction).super_exec_node.prev = peVar17;
              peVar17->next->prev = peVar18;
              peVar17->next = peVar18;
            }
            uVar20 = uVar20 + 1;
            lVar16 = lVar16 + 0x30;
            peVar17 = peVar18;
          } while (uVar20 < *(uint *)((long)&peVar5->prev + 4));
        }
        peVar17 = peVar19->prev;
        peVar17->prev = peVar19[1].next;
        (peVar19[1].next)->next = peVar17;
        peVar19->prev = (exec_node *)0x0;
        peVar19[1].next = (exec_node *)0x0;
      }
    }
    peVar19 = peVar6;
    peVar17 = peVar6;
    if (peVar6 == (exec_node *)0x0) {
      peVar5 = (exec_node *)0x0;
    }
    else {
      peVar5 = (exec_node *)&peVar6->prev[-1].prev;
      if (peVar6->prev->next == (exec_node *)0x0) {
        peVar5 = (exec_node *)0x0;
      }
    }
  } while( true );
}

Assistant:

void
lower_named_interface_blocks(void *mem_ctx, gl_linked_shader *shader)
{
   flatten_named_interface_blocks_declarations v_decl(mem_ctx);
   v_decl.run(shader->ir);
}